

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

void compare_struct_field(t_field *newField,t_field *oldField,string *oldStructName)

{
  bool bVar1;
  uint uVar2;
  e_req eVar3;
  t_type *newType;
  t_type *oldType;
  undefined8 uVar4;
  t_const_value *newStructDefault;
  t_const_value *oldStructDefault;
  string *psVar5;
  undefined1 local_58 [8];
  string fieldName;
  bool oldStructFieldOptional;
  bool newStructFieldOptional;
  t_type *oldFieldType;
  t_type *newFieldType;
  string *oldStructName_local;
  t_field *oldField_local;
  t_field *newField_local;
  
  newType = t_field::get_type(newField);
  oldType = t_field::get_type(oldField);
  bVar1 = compare_type(newType,oldType);
  if (!bVar1) {
    uVar2 = t_field::get_key(newField);
    uVar4 = std::__cxx11::string::c_str();
    thrift_audit_failure("Struct Field Type Changed for Id = %d in %s \n",(ulong)uVar2,uVar4);
  }
  eVar3 = t_field::get_req(newField);
  fieldName.field_2._M_local_buf[0xf] = eVar3 != T_REQUIRED;
  eVar3 = t_field::get_req(oldField);
  fieldName.field_2._M_local_buf[0xe] = eVar3 != T_REQUIRED;
  if ((fieldName.field_2._M_local_buf[0xf] & 1U) != fieldName.field_2._M_local_buf[0xe]) {
    uVar2 = t_field::get_key(newField);
    uVar4 = std::__cxx11::string::c_str();
    thrift_audit_failure
              ("Struct Field Requiredness Changed for Id = %d in %s \n",(ulong)uVar2,uVar4);
  }
  if (((fieldName.field_2._M_local_buf[0xf] & 1U) != 0) ||
     ((fieldName.field_2._M_local_buf[0xe] & 1U) != 0)) {
    newStructDefault = t_field::get_value(newField);
    oldStructDefault = t_field::get_value(oldField);
    bVar1 = compare_defaults(newStructDefault,oldStructDefault);
    if (!bVar1) {
      uVar2 = t_field::get_key(newField);
      uVar4 = std::__cxx11::string::c_str();
      thrift_audit_warning(1,"Default value changed for Id = %d in %s \n",(ulong)uVar2,uVar4);
    }
  }
  psVar5 = t_field::get_name_abi_cxx11_(newField);
  std::__cxx11::string::string((string *)local_58,(string *)psVar5);
  psVar5 = t_field::get_name_abi_cxx11_(oldField);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,psVar5);
  if (bVar1) {
    uVar2 = t_field::get_key(newField);
    uVar4 = std::__cxx11::string::c_str();
    thrift_audit_warning(1,"Struct field name changed for Id = %d in %s\n",(ulong)uVar2,uVar4);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void compare_struct_field(t_field* newField, t_field* oldField, std::string oldStructName)
{
   t_type* newFieldType = newField->get_type();
   t_type* oldFieldType = oldField->get_type();
   if(!compare_type(newFieldType, oldFieldType))
   {
      thrift_audit_failure("Struct Field Type Changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
   }

   // A Struct member can be optional if it is mentioned explicitly, or if it is assigned with default values.
   bool newStructFieldOptional = (newField->get_req() != t_field::T_REQUIRED);
   bool oldStructFieldOptional = (oldField->get_req() != t_field::T_REQUIRED);

   if(newStructFieldOptional != oldStructFieldOptional)
   {
      thrift_audit_failure("Struct Field Requiredness Changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
   }
   if(newStructFieldOptional || oldStructFieldOptional)
   {
      if(!compare_defaults(newField->get_value(), oldField->get_value()))
      {
         thrift_audit_warning(1, "Default value changed for Id = %d in %s \n", newField->get_key(), oldStructName.c_str());
      }
   }

   std::string fieldName = newField->get_name();
   if(fieldName != oldField->get_name())
   {
      thrift_audit_warning(1, "Struct field name changed for Id = %d in %s\n", newField->get_key(), oldStructName.c_str());
   }

}